

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  bool bVar1;
  reference key;
  Value *pVVar2;
  Value *pVVar3;
  PathArgument *arg;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_38;
  const_iterator it;
  Value *node;
  Value *defaultValue_local;
  Value *root_local;
  Path *this_local;
  
  it._M_current = (PathArgument *)root;
  local_38._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_);
  do {
    arg = (PathArgument *)
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)&arg);
    if (!bVar1) {
      Value::Value(__return_storage_ptr__,(Value *)it._M_current);
      return __return_storage_ptr__;
    }
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&local_38);
    if (key->kind_ == kindIndex) {
      bVar1 = Value::isArray((Value *)it._M_current);
      if ((!bVar1) || (bVar1 = Value::isValidIndex((Value *)it._M_current,key->index_), !bVar1)) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
      it._M_current = (PathArgument *)Value::operator[](it._M_current,key->index_);
    }
    else if (key->kind_ == kindKey) {
      bVar1 = Value::isObject((Value *)it._M_current);
      if (!bVar1) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
      pVVar2 = Value::operator[]((Value *)it._M_current,&key->key_);
      it._M_current = (PathArgument *)pVVar2;
      pVVar3 = Value::nullSingleton();
      if (pVVar2 == pVVar3) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}